

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeSetDefaultInputDrive(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_Time_t *pAVar1;
  Abc_ManTime_t *pAVar2;
  long lVar3;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  pAVar2 = pNtk->pManTime;
  (pAVar2->tInDriveDef).Rise = Rise;
  (pAVar2->tInDriveDef).Fall = Fall;
  if ((pAVar2->tInDrive != (Abc_Time_t *)0x0) && (0 < pNtk->vCis->nSize)) {
    lVar3 = 0;
    do {
      pAVar1 = pNtk->pManTime->tInDrive;
      if ((((pAVar1[lVar3].Rise == 0.0) && (!NAN(pAVar1[lVar3].Rise))) &&
          (pAVar1[lVar3].Fall == 0.0)) && (!NAN(pAVar1[lVar3].Fall))) {
        pAVar1[lVar3] = pNtk->pManTime->tInDriveDef;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pNtk->vCis->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultInputDrive( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
//    if ( Rise == 0.0 && Fall == 0.0 )
//        return;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tInDriveDef.Rise  = Rise;
    pNtk->pManTime->tInDriveDef.Fall  = Fall;
    if ( pNtk->pManTime->tInDrive != NULL )
    {
        int i;
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pNtk->pManTime->tInDrive[i].Rise == 0 && pNtk->pManTime->tInDrive[i].Fall == 0 )
                pNtk->pManTime->tInDrive[i] = pNtk->pManTime->tInDriveDef;
    }
}